

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_decimal128.hpp
# Opt level: O0

decimal128_from_chars_result
jsoncons::bson::decimal128_from_chars(char *first,char *last,decimal128_t *dec)

{
  bool bVar1;
  ushort uVar2;
  int iVar3;
  const_pointer a;
  const_pointer lastb;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  ulong extraout_RAX_07;
  ulong extraout_RAX_08;
  ulong extraout_RAX_09;
  ulong extraout_RAX_10;
  ulong *in_RDX;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  char *in_RSI;
  char *in_RDI;
  char *pcVar4;
  type tVar5;
  decimal128_from_chars_result dVar6;
  size_t d_idx_1;
  size_t d_idx;
  uint8_t round_digit;
  type result;
  uint16_t biased_exponent;
  uint64_t significand_low;
  uint64_t significand_high;
  int32_t exponent;
  size_t last_digit;
  size_t first_digit;
  uint16_t *digits_insert;
  uint16_t ndigits_stored;
  uint16_t digits [34];
  size_t first_nonzero;
  size_t radix_position;
  size_t ndigits;
  size_t ndigits_read;
  size_t significant_digits;
  bool found_nonzero;
  bool includes_sign;
  bool saw_radix;
  bool is_negative;
  char *str_read;
  bson_uint128_6464_t significand;
  ptrdiff_t len;
  string_view nan_str;
  string_view infinity_str;
  string_view inf_str;
  bool local_2a2;
  char *in_stack_fffffffffffffd60;
  char *in_stack_fffffffffffffd68;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffd70;
  char *in_stack_fffffffffffffd78;
  int *in_stack_fffffffffffffd80;
  size_t in_stack_fffffffffffffd88;
  char *in_stack_fffffffffffffd90;
  bson_uint128_6464_t *in_stack_fffffffffffffda0;
  uint64_t in_stack_fffffffffffffda8;
  uint64_t in_stack_fffffffffffffdb0;
  ulong local_240;
  ulong local_238;
  decimal128_t local_148;
  ulong local_130;
  int local_11c;
  ulong local_118;
  ushort *local_108;
  ushort local_fa;
  ushort local_f8 [40];
  long local_a8;
  long local_a0;
  ulong local_98;
  long local_90;
  ulong local_88;
  byte local_7c;
  byte local_7b;
  byte local_7a;
  byte local_79;
  char *local_78;
  ulong local_70;
  long local_68;
  long local_60;
  basic_string_view<char,_std::char_traits<char>_> local_58;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  ulong *local_28;
  char *local_20;
  char *local_18;
  char *local_10;
  undefined4 local_8;
  
  local_28 = in_RDX;
  local_20 = in_RSI;
  local_18 = in_RDI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  local_60 = (long)local_20 - (long)local_18;
  memset(&local_70,0,0x10);
  local_78 = local_18;
  local_79 = 0;
  local_7a = 0;
  local_7b = 0;
  local_7c = 0;
  local_88 = 0;
  local_90 = 0;
  local_98 = 0;
  local_a0 = 0;
  local_a8 = 0;
  memset(local_f8,0,0x44);
  local_fa = 0;
  local_108 = local_f8;
  local_28[1] = 0;
  *local_28 = 0;
  if ((*local_78 == '+') || (*local_78 == '-')) {
    local_79 = *local_78 == '-';
    local_7b = 1;
    local_78 = local_78 + 1;
  }
  iVar3 = isdigit((int)*local_78);
  if ((iVar3 == 0) && (*local_78 != '.')) {
    std::basic_string_view<char,_std::char_traits<char>_>::data(&local_38);
    std::basic_string_view<char,_std::char_traits<char>_>::data(&local_38);
    std::basic_string_view<char,_std::char_traits<char>_>::length(&local_38);
    bVar1 = detail::dec128_istreq
                      (in_stack_fffffffffffffd78,(char *)in_stack_fffffffffffffd70,
                       in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    if (!bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::data(&local_48);
      std::basic_string_view<char,_std::char_traits<char>_>::data(&local_48);
      std::basic_string_view<char,_std::char_traits<char>_>::length(&local_48);
      bVar1 = detail::dec128_istreq
                        (in_stack_fffffffffffffd78,(char *)in_stack_fffffffffffffd70,
                         in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
      if (!bVar1) {
        pcVar4 = local_78;
        a = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_58);
        lastb = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_58);
        std::basic_string_view<char,_std::char_traits<char>_>::length(&local_58);
        bVar1 = detail::dec128_istreq(a,local_20,pcVar4,lastb);
        if (bVar1) {
          decimal128_limits::nan(pcVar4);
          *local_28 = extraout_RAX;
          local_28[1] = extraout_RDX;
          local_10 = local_78;
          local_8 = 0;
        }
        else {
          decimal128_limits::nan(pcVar4);
          *local_28 = extraout_RAX_00;
          local_28[1] = extraout_RDX_00;
          local_10 = local_78;
          local_8 = 0x16;
        }
        goto LAB_001e5772;
      }
    }
    if ((local_79 & 1) == 0) {
      local_148 = decimal128_limits::infinity();
    }
    else {
      local_148 = decimal128_limits::neg_infinity();
    }
    *local_28 = local_148.low;
    local_28[1] = local_148.high;
    local_10 = local_78;
    local_8 = 0;
  }
  else {
LAB_001e4aec:
    pcVar4 = (char *)(ulong)(uint)(int)*local_78;
    iVar3 = isdigit((int)*local_78);
    if ((iVar3 != 0) || (local_2a2 = false, *local_78 == '.')) {
      local_2a2 = local_60 == -1 || local_78 < local_18 + local_60;
    }
    if (!local_2a2) {
      if (((local_7a & 1) != 0) && (local_90 == 0)) {
        decimal128_limits::nan(pcVar4);
        *local_28 = extraout_RAX_02;
        local_28[1] = extraout_RDX_02;
        local_10 = local_78;
        local_8 = 0x16;
        goto LAB_001e5772;
      }
      if ((*local_78 == 'e') || (*local_78 == 'E')) {
        pcVar4 = local_78 + 1;
        if (local_78[1] == '+') {
          pcVar4 = local_78 + 2;
        }
        local_78 = pcVar4;
        pcVar4 = local_78;
        tVar5 = jsoncons::detail::to_integer<int,char>
                          (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                           in_stack_fffffffffffffd80);
        if (tVar5.ec != success) {
          decimal128_limits::nan(pcVar4);
          *local_28 = extraout_RAX_03;
          local_28[1] = extraout_RDX_03;
          local_10 = local_78;
          local_8 = 0x16;
          goto LAB_001e5772;
        }
        local_78 = tVar5.ptr;
      }
      if (((local_60 == -1) || (local_78 < local_18 + local_60)) && (*local_78 != '\0')) {
        decimal128_limits::nan(pcVar4);
        *local_28 = extraout_RAX_04;
        local_28[1] = extraout_RDX_04;
        local_10 = local_78;
        local_8 = 0x16;
        goto LAB_001e5772;
      }
      if (local_fa == 0) {
        local_118 = 0;
        local_f8[0] = 0;
        local_98 = 1;
        local_fa = 1;
        local_88 = 0;
      }
      else {
        local_118 = (ulong)(int)(local_fa - 1);
        local_88 = local_98;
        while (local_18[local_a8 + local_88 + -1 + (ulong)(local_7b & 1) + (ulong)(local_7a & 1)] ==
               '0') {
          local_88 = local_88 - 1;
        }
      }
      local_11c = (int)local_a0;
      if ((local_11c < 0) || (local_11c < 0x4001)) {
        local_11c = -local_11c;
      }
      else {
        local_11c = -0x1820;
      }
      for (; 0x17df < local_11c; local_11c = local_11c + -1) {
        local_118 = local_118 + 1;
        if (0x22 < local_118) {
          if (local_88 != 0) {
            decimal128_limits::nan(pcVar4);
            *local_28 = extraout_RAX_05;
            local_28[1] = extraout_RDX_05;
            local_10 = local_78;
            local_8 = 0x16;
            goto LAB_001e5772;
          }
          local_11c = 0x17df;
          break;
        }
      }
      do {
        if (-0x1821 < local_11c && local_98 <= local_fa) {
LAB_001e534f:
          if ((local_118 + 1 < local_88) &&
             (local_18[local_a8 + local_118 + (ulong)(local_7b & 1) + (ulong)(local_7a & 1) + 1] !=
              '0')) {
            decimal128_limits::nan(pcVar4);
            *local_28 = extraout_RAX_10;
            local_28[1] = extraout_RDX_10;
            local_10 = local_78;
            local_8 = 0x16;
          }
          else {
            if (local_88 == 0) {
              local_130 = 0;
            }
            else if (local_118 < 0x11) {
              local_130 = (ulong)local_f8[0];
              for (local_238 = 1; local_238 <= local_118; local_238 = local_238 + 1) {
                local_130 = (ulong)local_f8[local_238] + local_130 * 10;
              }
            }
            else {
              for (local_240 = 1; local_240 <= local_118 - 0x11; local_240 = local_240 + 1) {
              }
              local_130 = (ulong)local_f8[local_240];
              while (local_240 = local_240 + 1, local_240 <= local_118) {
                local_130 = (ulong)local_f8[local_240] + local_130 * 10;
              }
            }
            detail::mul_64x64(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                              in_stack_fffffffffffffda0);
            if (local_130 + local_68 < local_130) {
              local_70 = local_70 + 1;
            }
            uVar2 = (short)local_11c + 0x1820;
            if ((local_70 >> 0x31 & 1) == 0) {
              local_28[1] = ((ulong)uVar2 & 0x3fff) << 0x31 | local_28[1];
              local_28[1] = local_70 & 0x1ffffffffffff | local_28[1];
            }
            else {
              local_28[1] = local_28[1] | 0x6000000000000000;
              local_28[1] = ((ulong)uVar2 & 0x3fff) << 0x2f | local_28[1];
              local_28[1] = local_70 & 0x7fffffffffff | local_28[1];
            }
            *local_28 = local_130 + local_68;
            if ((local_79 & 1) != 0) {
              local_28[1] = local_28[1] | 0x8000000000000000;
            }
            local_10 = local_78;
            local_8 = 0;
          }
          goto LAB_001e5772;
        }
        if (local_118 == 0) {
          if (local_88 != 0) {
            decimal128_limits::nan(pcVar4);
            *local_28 = extraout_RAX_06;
            local_28[1] = extraout_RDX_06;
            local_10 = local_78;
            local_8 = 0x16;
            goto LAB_001e5772;
          }
          local_11c = -0x1820;
          goto LAB_001e534f;
        }
        if (local_fa < local_98) {
          if ((local_18[(local_98 - 1) + (ulong)(local_7b & 1) + (ulong)(local_7a & 1)] != '0') &&
             (local_88 != 0)) {
            decimal128_limits::nan(pcVar4);
            *local_28 = extraout_RAX_07;
            local_28[1] = extraout_RDX_07;
            local_10 = local_78;
            local_8 = 0x16;
            goto LAB_001e5772;
          }
          local_98 = local_98 - 1;
        }
        else {
          if (local_f8[local_118] != 0) {
            decimal128_limits::nan(pcVar4);
            *local_28 = extraout_RAX_08;
            local_28[1] = extraout_RDX_08;
            local_10 = local_78;
            local_8 = 0x16;
            goto LAB_001e5772;
          }
          local_118 = local_118 - 1;
        }
        if (0x17de < local_11c) {
          decimal128_limits::nan(pcVar4);
          *local_28 = extraout_RAX_09;
          local_28[1] = extraout_RDX_09;
          local_10 = local_78;
          local_8 = 0x16;
          goto LAB_001e5772;
        }
        local_11c = local_11c + 1;
      } while( true );
    }
    if (*local_78 != '.') {
      if ((local_fa < 0x22) && ((*local_78 != '0' || ((local_7c & 1) != 0)))) {
        if ((local_7c & 1) == 0) {
          local_a8 = local_90;
        }
        local_7c = 1;
        *local_108 = (short)*local_78 - 0x30;
        local_fa = local_fa + 1;
        local_108 = local_108 + 1;
      }
      if ((local_7c & 1) != 0) {
        local_98 = local_98 + 1;
      }
      if ((local_7a & 1) != 0) {
        local_a0 = local_a0 + 1;
      }
      local_90 = local_90 + 1;
      local_78 = local_78 + 1;
      goto LAB_001e4aec;
    }
    if ((local_7a & 1) == 0) {
      local_7a = 1;
      local_78 = local_78 + 1;
      goto LAB_001e4aec;
    }
    decimal128_limits::nan(pcVar4);
    *local_28 = extraout_RAX_01;
    local_28[1] = extraout_RDX_01;
    local_10 = local_78;
    local_8 = 0x16;
  }
LAB_001e5772:
  dVar6.ec = local_8;
  dVar6.ptr = local_10;
  dVar6._12_4_ = 0;
  return dVar6;
}

Assistant:

inline
    decimal128_from_chars_result decimal128_from_chars(const char* first, const char* last, decimal128_t& dec) 
    {
        const string_view inf_str = "inf";
        const string_view infinity_str = "infinity";
        const string_view nan_str = "nan";

        ptrdiff_t len = last - first;

        bson_uint128_6464_t significand = {0,0};
 
        const char* str_read = first; /* Read pointer for consuming str. */
 
        /* Parsing state tracking */
        bool is_negative = false;
        bool saw_radix = false;
        bool includes_sign = false; /* True if the input first contains a sign. */
        bool found_nonzero = false;
 
        std::size_t significant_digits = 0; /* Total number of significant digits
                                        * (no leading or trailing zero) */
        std::size_t ndigits_read = 0;       /* Total number of significand digits read */
        std::size_t ndigits = 0;        /* Total number of digits (no leading zeros) */
        std::size_t radix_position = 0; /* The number of the digits after radix */
        std::size_t first_nonzero = 0;  /* The index of the first non-zero in *str* */
 
        uint16_t digits[decimal128_limits::max_digits] = {0};
        uint16_t ndigits_stored = 0;      /* The number of digits in digits */
        uint16_t *digits_insert = digits; /* Insertion pointer for digits */
        std::size_t first_digit = 0;           /* The index of the first non-zero digit */
        std::size_t last_digit = 0;            /* The index of the last digit */
 
        int32_t exponent = 0;
        uint64_t significand_high = 0; /* The high 17 digits of the significand */
        uint64_t significand_low = 0;  /* The low 17 digits of the significand */
        uint16_t biased_exponent = 0;  /* The biased exponent */
 
        dec.high = 0;
        dec.low = 0;
 
        if (*str_read == '+' || *str_read == '-') {
           is_negative = *(str_read++) == '-';
           includes_sign = true;
        }

        /* Check for Infinity or NaN */
        if (!isdigit(*str_read) && *str_read != '.') {
           if (detail::dec128_istreq (str_read, last, inf_str.data(), inf_str.data()+inf_str.length()) ||
               detail::dec128_istreq (str_read, last, infinity_str.data(), infinity_str.data()+infinity_str.length())) 
           {
               dec = is_negative ? decimal128_limits::neg_infinity() : decimal128_limits::infinity();
              return decimal128_from_chars_result{str_read,std::errc()};
           } else if (detail::dec128_istreq (str_read, last, nan_str.data(), nan_str.data()+nan_str.length())) {
              dec = decimal128_limits::nan();
              return decimal128_from_chars_result{str_read,std::errc()};
           }
 
           dec = decimal128_limits::nan();
           return decimal128_from_chars_result{str_read,std::errc::invalid_argument};
        }
 
        /* Read digits */
        while (((isdigit (*str_read) || *str_read == '.')) &&
               (len == -1 || str_read < first + len)) {
           if (*str_read == '.') {
              if (saw_radix) {
                 dec = decimal128_limits::nan();
                 return decimal128_from_chars_result{str_read,std::errc::invalid_argument};
              }
 
              saw_radix = true;
              str_read++;
              continue;
           }
 
           if (ndigits_stored < 34) {
              if (*str_read != '0' || found_nonzero) {
                 if (!found_nonzero) {
                    first_nonzero = ndigits_read;
                 }
 
                 found_nonzero = true;
                 *(digits_insert++) = *(str_read) - '0'; /* Only store 34 digits */
                 ndigits_stored++;
              }
           }
 
           if (found_nonzero) {
              ndigits++;
           }
 
           if (saw_radix) {
              radix_position++;
           }
 
           ndigits_read++;
           str_read++;
        }
 
        if (saw_radix && !ndigits_read) {
           dec = decimal128_limits::nan();
           return decimal128_from_chars_result{str_read,std::errc::invalid_argument};
        }
 
        /* Read exponent if exists */
        if (*str_read == 'e' || *str_read == 'E') {
           ++str_read;
           if (*str_read == '+') {
               ++str_read;
           }
           auto result = jsoncons::detail::to_integer(str_read, last - str_read, exponent);
           if (result.ec != jsoncons::detail::to_integer_errc()) 
           {
               dec = decimal128_limits::nan();
               return decimal128_from_chars_result{str_read,std::errc::invalid_argument};
           }
           str_read = result.ptr;
        }

        if ((len == -1 || str_read < first + len) && *str_read) {
           dec = decimal128_limits::nan();
           return decimal128_from_chars_result{str_read,std::errc::invalid_argument};
        }
 
        /* Done reading input. */
        /* Find first non-zero digit in digits */
        first_digit = 0;
 
        if (!ndigits_stored) { /* value is zero */
           first_digit = 0;
           last_digit = 0;
           digits[0] = 0;
           ndigits = 1;
           ndigits_stored = 1;
           significant_digits = 0;
        } else {
           last_digit = ndigits_stored - 1;
           significant_digits = ndigits;
           /* Mark trailing zeros as non-significant */
           while (first[first_nonzero + significant_digits - 1 + includes_sign +
                         saw_radix] == '0') {
              significant_digits--;
           }
        }
 
 
        /* Normalization of exponent */
        /* Correct exponent based on radix position, and shift significand as needed
         */
        /* to represent user input */
 
        /* Overflow prevention */
        if (exponent <= static_cast<int32_t>(radix_position) && static_cast<int32_t>(radix_position) - exponent > (1 << 14)) {
           exponent = decimal128_limits::exponent_min;
        } else {
           exponent -= static_cast<int32_t>(radix_position);
        }
 
        /* Attempt to normalize the exponent */
        while (exponent > decimal128_limits::exponent_max) {
           /* Shift exponent to significand and decrease */
           last_digit++;
 
           if (last_digit - first_digit > decimal128_limits::max_digits) {
              /* The exponent is too great to shift into the significand. */
              if (significant_digits == 0) {
                 /* Value is zero, we are allowed to clamp the exponent. */
                 exponent = decimal128_limits::exponent_max;
                 break;
              }
 
              /* Overflow is not permitted, error. */
              dec = decimal128_limits::nan();
              return decimal128_from_chars_result{str_read,std::errc::invalid_argument};
           }
 
           exponent--;
        }
 
        while (exponent < decimal128_limits::exponent_min || ndigits_stored < ndigits) {
           /* Shift last digit */
           if (last_digit == 0) {
              /* underflow is not allowed, but zero clamping is */
              if (significant_digits == 0) {
                 exponent = decimal128_limits::exponent_min;
                 break;
              }
 
              dec = decimal128_limits::nan();
              return decimal128_from_chars_result{str_read,std::errc::invalid_argument};
           }
 
           if (ndigits_stored < ndigits) {
              if (first[ndigits - 1 + includes_sign + saw_radix] - '0' != 0 &&
                  significant_digits != 0) {
                 dec = decimal128_limits::nan();
                 return decimal128_from_chars_result{str_read,std::errc::invalid_argument};
              }
 
              ndigits--; /* adjust to match digits not stored */
           } else {
              if (digits[last_digit] != 0) {
                 /* Inexact rounding is not allowed. */
                 dec = decimal128_limits::nan();
                 return decimal128_from_chars_result{str_read,std::errc::invalid_argument};
              }
 
 
              last_digit--; /* adjust to round */
           }
 
           if (exponent < decimal128_limits::exponent_max) {
              exponent++;
           } else {
              dec = decimal128_limits::nan();
              return decimal128_from_chars_result{str_read,std::errc::invalid_argument};
           }
        }
 
        /* Round */
        /* We've normalized the exponent, but might still need to round. */
        if (last_digit - first_digit + 1 < significant_digits) {
           uint8_t round_digit;
 
           /* There are non-zero digits after last_digit that need rounding. */
           /* We round to nearest, ties to even */
           round_digit =
              first[first_nonzero + last_digit + includes_sign + saw_radix + 1] -
              '0';
 
           if (round_digit != 0) {
              /* Inexact (non-zero) rounding is not allowed */
              dec = decimal128_limits::nan();
              return decimal128_from_chars_result{str_read,std::errc::invalid_argument};
           }
        }
 
        /* Encode significand */
        significand_high = 0,   /* The high 17 digits of the significand */
           significand_low = 0; /* The low 17 digits of the significand */
 
        if (significant_digits == 0) { /* read a zero */
           significand_high = 0;
           significand_low = 0;
        } else if (last_digit - first_digit < 17) {
           std::size_t d_idx = first_digit;
           significand_low = digits[d_idx++];
 
           for (; d_idx <= last_digit; d_idx++) {
              significand_low *= 10;
              significand_low += digits[d_idx];
              significand_high = 0;
           }
        } else {
           std::size_t d_idx = first_digit;
           significand_high = digits[d_idx++];
 
           for (; d_idx <= last_digit - 17; d_idx++) {
              significand_high *= 10;
              significand_high += digits[d_idx];
           }
 
           significand_low = digits[d_idx++];
 
           for (; d_idx <= last_digit; d_idx++) {
              significand_low *= 10;
              significand_low += digits[d_idx];
           }
        }
 
        detail::mul_64x64 (significand_high, 100000000000000000ull, &significand);
        significand.low += significand_low;
 
        if (significand.low < significand_low) {
           significand.high += 1;
        }
 
 
        biased_exponent = static_cast<uint16_t>(exponent + static_cast<int32_t>(decimal128_limits::exponent_bias));
 
        /* Encode combination, exponent, and significand. */
        if ((significand.high >> 49) & 1) {
           /* Encode '11' into bits 1 to 3 */
           dec.high |= (0x3ull << 61);
           dec.high |= (biased_exponent & 0x3fffull) << 47;
           dec.high |= significand.high & 0x7fffffffffffull;
        } else {
           dec.high |= (biased_exponent & 0x3fffull) << 49;
           dec.high |= significand.high & 0x1ffffffffffffull;
        }
 
        dec.low = significand.low;
 
        /* Encode sign */
        if (is_negative) {
           dec.high |= 0x8000000000000000ull;
        }
 
        return decimal128_from_chars_result{str_read,std::errc()};
    }